

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O2

void __thiscall hgdb::json::Module::add_instance(Module *this,string *name,Module *m)

{
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_hgdb::json::Module_*>
  local_50;
  
  std::__cxx11::string::string((string *)&local_50,(string *)name);
  local_50.second = m;
  std::
  vector<std::pair<std::__cxx11::string,hgdb::json::Module_const*>,std::allocator<std::pair<std::__cxx11::string,hgdb::json::Module_const*>>>
  ::emplace_back<std::pair<std::__cxx11::string,hgdb::json::Module_const*>>
            ((vector<std::pair<std::__cxx11::string,hgdb::json::Module_const*>,std::allocator<std::pair<std::__cxx11::string,hgdb::json::Module_const*>>>
              *)&this->instances_,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::operator()(&this->remove_inst_,&m->name_);
  return;
}

Assistant:

void add_instance(const std::string &name, const Module *m) {
        instances_.emplace_back(std::make_pair(name, m));
        remove_inst_(m->name_);
    }